

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O2

int cm_zlib_gzputc(gzFile file,int c)

{
  int iVar1;
  z_size_t zVar2;
  uchar *puVar3;
  ulong uVar4;
  uint uVar5;
  uchar *puVar6;
  uchar buf [1];
  
  uVar5 = 0xffffffff;
  if (((file != (gzFile)0x0) && (file[1].have == 0x79b1)) && (*(int *)((long)&file[4].pos + 4) == 0)
     ) {
    if ((int)file[4].pos != 0) {
      *(undefined4 *)&file[4].pos = 0;
      iVar1 = gz_zero((gz_statep)file,(off_t)file[4].next);
      if (iVar1 == -1) {
        return -1;
      }
    }
    uVar5 = (uint)file[1].pos;
    if (uVar5 != 0) {
      uVar4 = (ulong)(uint)file[5].pos;
      if (uVar4 == 0) {
        puVar3 = *(uchar **)(file + 2);
        file[5].next = puVar3;
        puVar6 = puVar3;
      }
      else {
        puVar3 = *(uchar **)(file + 2);
        puVar6 = file[5].next;
      }
      if ((uint)(puVar6 + (uVar4 - (long)puVar3)) < uVar5) {
        puVar3[(ulong)(puVar6 + (uVar4 - (long)puVar3)) & 0xffffffff] = (uchar)c;
        *(int *)&file[5].pos = (int)file[5].pos + 1;
        file->pos = file->pos + 1;
        return c & 0xff;
      }
    }
    buf[0] = (uchar)c;
    zVar2 = gz_write((gz_statep)file,buf,1);
    uVar5 = 0xffffffff;
    if (zVar2 == 1) {
      uVar5 = c & 0xff;
    }
  }
  return uVar5;
}

Assistant:

int ZEXPORT gzputc(gzFile file, int c) {
    unsigned have;
    unsigned char buf[1];
    gz_statep state;
    z_streamp strm;

    /* get internal structure */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;
    strm = &(state->strm);

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK)
        return -1;

    /* check for seek request */
    if (state->seek) {
        state->seek = 0;
        if (gz_zero(state, state->skip) == -1)
            return -1;
    }

    /* try writing to input buffer for speed (state->size == 0 if buffer not
       initialized) */
    if (state->size) {
        if (strm->avail_in == 0)
            strm->next_in = state->in;
        have = (unsigned)((strm->next_in + strm->avail_in) - state->in);
        if (have < state->size) {
            state->in[have] = (unsigned char)c;
            strm->avail_in++;
            state->x.pos++;
            return c & 0xff;
        }
    }

    /* no room in buffer or not initialized, use gz_write() */
    buf[0] = (unsigned char)c;
    if (gz_write(state, buf, 1) != 1)
        return -1;
    return c & 0xff;
}